

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O1

void __thiscall GmmLib::GmmXe_LPGCachePolicy::SetUpMOCSTable(GmmXe_LPGCachePolicy *this)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  Context *pCVar14;
  int index;
  long lVar15;
  
  pCVar14 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pGmmLibContext;
  *(undefined8 *)
   &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  lVar15 = 0;
  do {
    uVar1 = pCVar14->CachePolicyTbl[lVar15].L3;
    pCVar14->CachePolicyTbl[lVar15].L3.UshortValue = uVar1 & 0xff0f | 0x90;
    pCVar14->CachePolicyTbl[lVar15].LeCC.DwordValue =
         pCVar14->CachePolicyTbl[lVar15].LeCC.DwordValue & 0xfffffef3 | 0xc;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x40);
  uVar2 = pCVar14->CachePolicyTbl[1].L3;
  uVar3 = pCVar14->CachePolicyTbl[0].L3;
  pCVar14->CachePolicyTbl[0].L3.UshortValue = uVar3 & 0xff0f | 0xb0;
  pCVar14->CachePolicyTbl[0].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[0].LeCC.DwordValue & 0xfffffef3 | 0x100;
  pCVar14->CachePolicyTbl[1].L3.UshortValue = uVar2 & 0xff0f | 0xb0;
  pCVar14->CachePolicyTbl[1].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[1].LeCC.DwordValue & 0xfffffef3 | 0x100;
  uVar4 = pCVar14->CachePolicyTbl[2].L3;
  pCVar14->CachePolicyTbl[2].L3.UshortValue = uVar4 & 0xff0f | 0x90;
  pCVar14->CachePolicyTbl[2].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[2].LeCC.DwordValue & 0xfffffef3 | 0x100;
  uVar5 = pCVar14->CachePolicyTbl[3].L3;
  pCVar14->CachePolicyTbl[3].L3.UshortValue = uVar5 & 0xff0f | 0x90;
  pCVar14->CachePolicyTbl[3].LeCC.DwordValue = pCVar14->CachePolicyTbl[3].LeCC.DwordValue | 0x10c;
  uVar6 = pCVar14->CachePolicyTbl[4].L3;
  pCVar14->CachePolicyTbl[4].L3.UshortValue = uVar6 & 0xff0f | 0xd0;
  pCVar14->CachePolicyTbl[4].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[4].LeCC.DwordValue & 0xfffffef3 | 0x100;
  uVar7 = pCVar14->CachePolicyTbl[5].L3;
  pCVar14->CachePolicyTbl[5].L3.UshortValue = uVar7 & 0xff0f | 0xd0;
  pCVar14->CachePolicyTbl[5].LeCC.DwordValue = pCVar14->CachePolicyTbl[5].LeCC.DwordValue | 0x10c;
  uVar8 = pCVar14->CachePolicyTbl[6].L3;
  pCVar14->CachePolicyTbl[6].L3.UshortValue = uVar8 & 0xff0f | 0x10;
  pCVar14->CachePolicyTbl[6].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[6].LeCC.DwordValue & 0xfffffef3 | 0x100;
  uVar9 = pCVar14->CachePolicyTbl[7].L3;
  pCVar14->CachePolicyTbl[7].L3.UshortValue = uVar9 & 0xff0f | 0x10;
  pCVar14->CachePolicyTbl[7].LeCC.DwordValue = pCVar14->CachePolicyTbl[7].LeCC.DwordValue | 0x10c;
  uVar10 = pCVar14->CachePolicyTbl[8].L3;
  pCVar14->CachePolicyTbl[8].L3.UshortValue = uVar10 & 0xff0f | 0x50;
  pCVar14->CachePolicyTbl[8].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[8].LeCC.DwordValue & 0xfffffef3 | 0x100;
  uVar11 = pCVar14->CachePolicyTbl[9].L3;
  pCVar14->CachePolicyTbl[9].L3.UshortValue = uVar11 & 0xff0f | 0x50;
  pCVar14->CachePolicyTbl[9].LeCC.DwordValue = pCVar14->CachePolicyTbl[9].LeCC.DwordValue | 0x10c;
  uVar12 = pCVar14->CachePolicyTbl[0xe].L3;
  pCVar14->CachePolicyTbl[0xe].L3.UshortValue = uVar12 & 0xff0f | 0xb0;
  pCVar14->CachePolicyTbl[0xe].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[0xe].LeCC.DwordValue & 0xfffffef3 | 0x104;
  uVar13 = pCVar14->CachePolicyTbl[0xf].L3;
  pCVar14->CachePolicyTbl[0xf].L3.UshortValue = uVar13 & 0xff0f | 0x50;
  pCVar14->CachePolicyTbl[0xf].LeCC.DwordValue =
       pCVar14->CachePolicyTbl[0xf].LeCC.DwordValue & 0xfffffef3 | 0x100;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 0xf;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0;
  return;
}

Assistant:

void GmmLib::GmmXe_LPGCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);
    CurrentMaxL1HdcMocsIndex                             = 0;
    CurrentMaxSpecialMocsIndex                           = 0;

#define L3_UC (0x1)
#define L3_WB (0x3)

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define GMM_DEFINE_MOCS(Index, L3_LookUp, L3_Go, L3_CC, L4Caching, ignorePAT)      \
    {                                                                              \
        pCachePolicyTlbElement[Index].L3.Cacheability      = L3_CC;                \
        pCachePolicyTlbElement[Index].L3.GlobalGo          = L3_Go;                \
        pCachePolicyTlbElement[Index].L3.UCLookup          = L3_LookUp;            \
        pCachePolicyTlbElement[Index].LeCC.Xe_LPG.L4CC     = L4Caching;            \
        pCachePolicyTlbElement[Index].LeCC.Xe_LPG.igPAT    = ignorePAT;            \
    }
    // clang-format off

    //Default MOCS Table
    for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
    {     //             Index    LookUp  Go      L3CC        L4CC   ignorePAT
        GMM_DEFINE_MOCS( index  , 1     , 0     , L3_UC     , L4_UC     , 0)
    }
    // Fixed MOCS Table
    //             Index      LookUp  Go      L3CC       L4CC   ignorePAT
    GMM_DEFINE_MOCS( 0      , 1     , 0     , L3_WB    , L4_WB , 1)
    GMM_DEFINE_MOCS( 1      , 1     , 0     , L3_WB    , L4_WB , 1)
    GMM_DEFINE_MOCS( 2      , 1     , 0     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 3      , 1     , 0     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 4      , 1     , 1     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 5      , 1     , 1     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 6      , 0     , 0     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 7      , 0     , 0     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 8      , 0     , 1     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 9      , 0     , 1     , L3_UC    , L4_UC , 1)
    //Reserved 10-13
    GMM_DEFINE_MOCS( 14     , 1     , 0     , L3_WB    , L4_WT , 1) /* Note Update GMM_CC_DISP_MOCS_INDEX*/
    GMM_DEFINE_MOCS( 15     , 0     , 1     , L3_UC    , L4_WB , 1) /* Note Update GMM_NON_CC_DISP_MOCS_INDEX */

    CurrentMaxMocsIndex         = 15;
    CurrentMaxL1HdcMocsIndex    = 0;
    CurrentMaxSpecialMocsIndex  = 0;

// clang-format on
#undef GMM_DEFINE_MOCS
#undef L4_WB
#undef L4_WT
#undef L4_UC
#undef L3_UC
#undef L3_WB
}